

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O2

iterator_range<std::_Fwd_list_const_iterator<int>_> __thiscall
burst::algorithm::
bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::active_search<std::_Fwd_list_const_iterator<int>>
          (bitap<int,std::bitset<32ul>,std::map<int,std::bitset<32ul>,std::less<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> match_candidate,
          _Fwd_list_const_iterator<int> corpus_current,_Fwd_list_const_iterator<int> corpus_end,
          bitmask_type *hint)

{
  bitmask_type bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  iterator_range<std::_Fwd_list_const_iterator<int>_> iVar5;
  
  uVar2 = *(long *)(*(long *)this + 0x30) - 1;
  uVar3 = 0;
  if (uVar2 < 0x20) {
    uVar3 = 1L << ((byte)uVar2 & 0x3f) & 0xffffffff;
  }
  uVar2 = (hint->super__Base_bitset<1UL>)._M_w;
  do {
    if (corpus_current._M_node == corpus_end._M_node) {
      bVar4 = (uVar2 & uVar3) == 0;
LAB_001e1595:
      if (bVar4) {
        corpus_current._M_node = corpus_end._M_node;
        match_candidate._M_node = corpus_end._M_node;
      }
      iVar5.
      super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_node = corpus_current._M_node;
      iVar5.
      super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_node = match_candidate._M_node;
      return (iterator_range<std::_Fwd_list_const_iterator<int>_>)
             iVar5.
             super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      ;
    }
    if ((uVar2 & uVar3) != 0) {
      bVar4 = false;
      goto LAB_001e1595;
    }
    bVar1 = algorithm::detail::
            element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
            ::operator[](*(element_position_bitmask_table<std::map<int,_std::bitset<32UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                           **)this,(key_type *)(corpus_current._M_node + 1));
    uVar2 = (ulong)((uint)bVar1.super__Base_bitset<1UL>._M_w & (int)uVar2 * 2 + 1U);
    (hint->super__Base_bitset<1UL>)._M_w = uVar2;
    corpus_current._M_node = (corpus_current._M_node)->_M_next;
    match_candidate._M_node = (match_candidate._M_node)->_M_next;
  } while( true );
}

Assistant:

boost::iterator_range<ForwardIterator>
                active_search
                (
                    ForwardIterator match_candidate,
                    ForwardIterator corpus_current,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                // Индикатор совпадения — единица на N-м месте в битовой маске,
                // где N — количество элементов в искомом образце.
                const auto match_indicator =
                    left_shift(bitmask_type{0b1}, m_bitmask_table->length() - 1u);
                auto & match_column = hint;

                while (corpus_current != corpus_end && (match_column & match_indicator) == 0)
                {
                    match_column = bit_shift(match_column) & (*m_bitmask_table)[*corpus_current];
                    ++corpus_current;
                    ++match_candidate;
                }

                return (match_column & match_indicator) == 0
                    ? boost::make_iterator_range(corpus_end, corpus_end)
                    : boost::make_iterator_range(match_candidate, corpus_current);
            }